

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_spectrum.unit.cpp
# Opt level: O1

void __thiscall
TestCreateSpectrum_TestCreateSpectrum_Blackbody_Test::
~TestCreateSpectrum_TestCreateSpectrum_Blackbody_Test
          (TestCreateSpectrum_TestCreateSpectrum_Blackbody_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(TestCreateSpectrum, TestCreateSpectrum_Blackbody) {
	SCOPED_TRACE("Begin Test: Load Spectrum Blackbody.");

	std::string line = "Blackbody (T=300.0K)";

	Spectrum spectrum = create_spectrum(line, "");

	EXPECT_EQ(spectrum.type, Spectrum_Type::BLACKBODY);
	EXPECT_EQ(spectrum.description, "Blackbody");
	EXPECT_EQ(spectrum.t, 300.0);
	std::vector<std::pair<double, double>> empty_vec;
	EXPECT_EQ(spectrum.values, empty_vec);

}